

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O1

bool sptk::ReadStream(Matrix *matrix_to_read,istream *input_stream)

{
  int iVar1;
  int iVar2;
  
  if (matrix_to_read == (Matrix *)0x0) {
    return false;
  }
  iVar1 = matrix_to_read->num_row_;
  if (iVar1 != 0) {
    iVar2 = matrix_to_read->num_column_;
    if (((input_stream != (istream *)0x0 && iVar2 != 0) &&
        (((byte)input_stream[*(long *)(*(long *)input_stream + -0x18) + 0x20] & 2) == 0)) &&
       (std::istream::read((char *)input_stream,
                           (long)*(matrix_to_read->index_).
                                  super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                                  super__Vector_impl_data._M_start),
       *(long *)(input_stream + 8) == (long)(iVar1 * iVar2 * 8))) {
      return ((byte)input_stream[*(long *)(*(long *)input_stream + -0x18) + 0x20] & 5) == 0;
    }
    return false;
  }
  return false;
}

Assistant:

bool ReadStream(sptk::Matrix* matrix_to_read, std::istream* input_stream) {
  if (NULL == matrix_to_read || 0 == matrix_to_read->GetNumRow() ||
      0 == matrix_to_read->GetNumColumn() || NULL == input_stream ||
      input_stream->eof()) {
    return false;
  }

  const int type_byte(sizeof((*matrix_to_read)[0][0]));

  const int num_read_bytes(type_byte * matrix_to_read->GetNumRow() *
                           matrix_to_read->GetNumColumn());
  input_stream->read(reinterpret_cast<char*>(&((*matrix_to_read)[0][0])),
                     num_read_bytes);

  return (num_read_bytes == input_stream->gcount()) ? !input_stream->fail()
                                                    : false;
}